

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

long __thiscall FString::IndexOf(FString *this,char *substr,long startIndex)

{
  size_t sVar1;
  char *pcVar2;
  char *str;
  long startIndex_local;
  char *substr_local;
  FString *this_local;
  
  if ((0 < startIndex) && (sVar1 = Len(this), sVar1 <= (ulong)startIndex)) {
    return -1;
  }
  pcVar2 = strstr(this->Chars + startIndex,substr);
  if (pcVar2 == (char *)0x0) {
    this_local = (FString *)0xffffffffffffffff;
  }
  else {
    this_local = (FString *)(pcVar2 + -(long)this->Chars);
  }
  return (long)this_local;
}

Assistant:

long FString::IndexOf (const char *substr, long startIndex) const
{
	if (startIndex > 0 && Len() <= (size_t)startIndex)
	{
		return -1;
	}
	char *str = strstr (Chars + startIndex, substr);
	if (str == NULL)
	{
		return -1;
	}
	return long(str - Chars);
}